

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OmegaOP.cpp
# Opt level: O0

void __thiscall OmegaOP::~OmegaOP(OmegaOP *this)

{
  uint local_20;
  uint local_1c;
  uint i_3;
  uint i_2;
  uint i_1;
  uint i;
  OmegaOP *this_local;
  
  if (this->states != (double *)0x0) {
    operator_delete(this->states);
  }
  this->states = (double *)0x0;
  for (i_2 = 0; i_2 < 3; i_2 = i_2 + 1) {
    if (this->S12P[i_2] != (double *)0x0) {
      operator_delete(this->S12P[i_2]);
    }
  }
  for (i_3 = 0; i_3 < this->nbStates; i_3 = i_3 + 1) {
    if (this->Q[i_3] != (double *)0x0) {
      operator_delete(this->Q[i_3]);
    }
  }
  for (local_1c = 0; local_1c < this->nbStates; local_1c = local_1c + 1) {
    if (this->lastChpt[local_1c] != (uint *)0x0) {
      operator_delete(this->lastChpt[local_1c]);
    }
  }
  for (local_20 = 0; local_20 < this->nbStates; local_20 = local_20 + 1) {
    if (this->lastIndState[local_20] != (uint *)0x0) {
      operator_delete(this->lastIndState[local_20]);
    }
  }
  if (this->S12P != (double **)0x0) {
    operator_delete__(this->S12P);
  }
  this->S12P = (double **)0x0;
  if (this->Q != (double **)0x0) {
    operator_delete__(this->Q);
  }
  this->Q = (double **)0x0;
  if (this->lastChpt != (uint **)0x0) {
    operator_delete__(this->lastChpt);
  }
  this->lastChpt = (uint **)0x0;
  if (this->lastIndState != (uint **)0x0) {
    operator_delete__(this->lastIndState);
  }
  this->lastIndState = (uint **)0x0;
  std::vector<double,_std::allocator<double>_>::~vector(&this->parameters);
  std::vector<int,_std::allocator<int>_>::~vector(&this->changepoints);
  return;
}

Assistant:

OmegaOP::~OmegaOP()
{
  delete(states);
  states = NULL;
  for(unsigned int i = 0; i < 3; i++){delete(S12P[i]);}
  for(unsigned int i = 0; i < nbStates; i++){delete(Q[i]);}
  for(unsigned int i = 0; i < nbStates; i++){delete(lastChpt[i]);}
  for(unsigned int i = 0; i < nbStates; i++){delete(lastIndState[i]);}
  delete [] S12P;
  S12P = NULL;
  delete [] Q;
  Q = NULL;
  delete [] lastChpt;
  lastChpt = NULL;
  delete [] lastIndState;
  lastIndState = NULL;
}